

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes<MediumAllocationBlockAttributes>
          (RecyclerSweepManager *this,SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint unaccountedAllocBytes;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  RecyclerSweepManager *this_local;
  
  if ((this->recycler->inPartialCollectMode & 1U) == 0) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearAllAllocBytes(heapBlock);
  }
  else {
    uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearUnaccountedAllocBytes
                      (heapBlock);
    if ((heapBlock->lastUncollectedAllocBytes != 0) && (uVar3 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x136,
                         "(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0)"
                         ,"heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    heapBlock->lastUncollectedAllocBytes = uVar3 + heapBlock->lastUncollectedAllocBytes;
    this->recycler->partialUncollectedAllocBytes =
         (ulong)uVar3 + this->recycler->partialUncollectedAllocBytes;
    this->nextPartialUncollectedAllocBytes = (ulong)uVar3 + this->nextPartialUncollectedAllocBytes;
  }
  return;
}

Assistant:

void
RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes(SmallHeapBlockT<TBlockAttributes> * heapBlock)
{
#if ENABLE_PARTIAL_GC
    // Only need to update the unaccounted alloc bytes if we are in partial collect mode
    if (recycler->inPartialCollectMode)
    {
        uint unaccountedAllocBytes = heapBlock->GetAndClearUnaccountedAllocBytes();
        Assert(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0);
        DebugOnly(heapBlock->lastUncollectedAllocBytes += unaccountedAllocBytes);
        recycler->partialUncollectedAllocBytes += unaccountedAllocBytes;
        this->nextPartialUncollectedAllocBytes += unaccountedAllocBytes;
    }
    else
#endif
    {
        // We don't care, clear the unaccounted to start tracking for new object for next GC
        heapBlock->ClearAllAllocBytes();
    }
}